

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmExportInstallFileGenerator.cxx
# Opt level: O0

bool __thiscall
cmExportInstallFileGenerator::GenerateImportFileConfig
          (cmExportInstallFileGenerator *this,string *config,
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *missingTargets)

{
  bool bVar1;
  byte bVar2;
  ulong uVar3;
  char *pcVar4;
  ostream *poVar5;
  mapped_type *this_00;
  ostream *os;
  string local_478 [32];
  undefined1 local_458 [8];
  ostringstream e;
  string local_2e0 [8];
  string se;
  cmGeneratedFileStream exportFileStream;
  string local_48 [8];
  string fileName;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *missingTargets_local;
  string *config_local;
  cmExportInstallFileGenerator *this_local;
  
  fileName.field_2._8_8_ = missingTargets;
  bVar1 = cmInstallGenerator::InstallsForConfig(&this->IEGen->super_cmInstallGenerator,config);
  if (bVar1) {
    std::__cxx11::string::string(local_48,(string *)&(this->super_cmExportFileGenerator).FileDir);
    std::__cxx11::string::operator+=(local_48,"/");
    std::__cxx11::string::operator+=
              (local_48,(string *)&(this->super_cmExportFileGenerator).FileBase);
    std::__cxx11::string::operator+=(local_48,"-");
    uVar3 = std::__cxx11::string::empty();
    if ((uVar3 & 1) == 0) {
      cmsys::SystemTools::LowerCase((string *)&exportFileStream.field_0x240,config);
      std::__cxx11::string::operator+=(local_48,(string *)&exportFileStream.field_0x240);
      std::__cxx11::string::~string((string *)&exportFileStream.field_0x240);
    }
    else {
      std::__cxx11::string::operator+=(local_48,"noconfig");
    }
    std::__cxx11::string::operator+=
              (local_48,(string *)&(this->super_cmExportFileGenerator).FileExt);
    pcVar4 = (char *)std::__cxx11::string::c_str();
    cmGeneratedFileStream::cmGeneratedFileStream
              ((cmGeneratedFileStream *)((long)&se.field_2 + 8),pcVar4,true,None);
    bVar2 = std::ios::operator!((ios *)((long)&se.field_2 + *(long *)(se.field_2._8_8_ + -0x18) + 8)
                               );
    bVar1 = (bVar2 & 1) != 0;
    if (bVar1) {
      cmsys::SystemTools::GetLastSystemError_abi_cxx11_();
      std::__cxx11::ostringstream::ostringstream((ostringstream *)local_458);
      poVar5 = std::operator<<((ostream *)local_458,"cannot write to file \"");
      poVar5 = std::operator<<(poVar5,local_48);
      poVar5 = std::operator<<(poVar5,"\": ");
      std::operator<<(poVar5,local_2e0);
      std::__cxx11::ostringstream::str();
      pcVar4 = (char *)std::__cxx11::string::c_str();
      cmSystemTools::Error(pcVar4,(char *)0x0,(char *)0x0,(char *)0x0);
      std::__cxx11::string::~string(local_478);
      std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_458);
      std::__cxx11::string::~string(local_2e0);
    }
    else {
      poVar5 = (ostream *)((long)&se.field_2 + 8);
      (*(this->super_cmExportFileGenerator)._vptr_cmExportFileGenerator[4])(this,poVar5,config);
      cmExportFileGenerator::GenerateImportConfig
                (&this->super_cmExportFileGenerator,poVar5,config,
                 (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  *)fileName.field_2._8_8_);
      (*(this->super_cmExportFileGenerator)._vptr_cmExportFileGenerator[5])(this,poVar5);
      this_00 = std::
                map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                ::operator[](&this->ConfigImportFiles,config);
      std::__cxx11::string::operator=((string *)this_00,local_48);
    }
    this_local._7_1_ = !bVar1;
    cmGeneratedFileStream::~cmGeneratedFileStream((cmGeneratedFileStream *)((long)&se.field_2 + 8));
    std::__cxx11::string::~string(local_48);
  }
  else {
    this_local._7_1_ = true;
  }
  return this_local._7_1_;
}

Assistant:

bool cmExportInstallFileGenerator::GenerateImportFileConfig(
  const std::string& config, std::vector<std::string>& missingTargets)
{
  // Skip configurations not enabled for this export.
  if (!this->IEGen->InstallsForConfig(config)) {
    return true;
  }

  // Construct the name of the file to generate.
  std::string fileName = this->FileDir;
  fileName += "/";
  fileName += this->FileBase;
  fileName += "-";
  if (!config.empty()) {
    fileName += cmSystemTools::LowerCase(config);
  } else {
    fileName += "noconfig";
  }
  fileName += this->FileExt;

  // Open the output file to generate it.
  cmGeneratedFileStream exportFileStream(fileName.c_str(), true);
  if (!exportFileStream) {
    std::string se = cmSystemTools::GetLastSystemError();
    std::ostringstream e;
    e << "cannot write to file \"" << fileName << "\": " << se;
    cmSystemTools::Error(e.str().c_str());
    return false;
  }
  std::ostream& os = exportFileStream;

  // Start with the import file header.
  this->GenerateImportHeaderCode(os, config);

  // Generate the per-config target information.
  this->GenerateImportConfig(os, config, missingTargets);

  // End with the import file footer.
  this->GenerateImportFooterCode(os);

  // Record this per-config import file.
  this->ConfigImportFiles[config] = fileName;

  return true;
}